

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

void __thiscall Mat::Assemble(Mat *this,Mat *a,Mat *b)

{
  int iVar1;
  double dVar2;
  int local_28;
  int local_24;
  int j;
  int i;
  Mat *b_local;
  Mat *a_local;
  Mat *this_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = Size(a);
    if (iVar1 <= local_24) break;
    dVar2 = operator()(a,local_24);
    this->v_[local_24] = dVar2;
    local_24 = local_24 + 1;
  }
  local_28 = 0;
  while( true ) {
    iVar1 = Size(b);
    if (iVar1 <= local_28) break;
    dVar2 = operator()(b,local_28);
    this->v_[local_28] = dVar2;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void Mat::Assemble(const Mat & a, const Mat &b)
{	
	for (int i=0 ; i<a.Size() ; i++)
		v_[i] = a(i);
	for (int j=0 ; j<b.Size(); j++)
		v_[j] = b(j);
}